

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int __thiscall
s2pred::TriageCompareSin2Distances<long_double>
          (s2pred *this,Vector3<long_double> *x,Vector3<long_double> *a,Vector3<long_double> *b)

{
  int iVar1;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble local_38;
  longdouble local_28;
  
  GetSin2Distance((longdouble *)x,(Vector3_ld *)this,(Vector3_ld *)&stack0xffffffffffffffd8,
                  (longdouble *)b);
  GetSin2Distance((longdouble *)a,(Vector3_ld *)this,(Vector3_ld *)&local_38,(longdouble *)b);
  iVar1 = 1;
  if (in_ST0 - in_ST1 <= local_38 + local_28) {
    iVar1 = -(uint)(in_ST0 - in_ST1 < -(local_38 + local_28));
  }
  return iVar1;
}

Assistant:

int TriageCompareSin2Distances(const Vector3<T>& x,
                               const Vector3<T>& a, const Vector3<T>& b) {
  T sin2_ax_error, sin2_bx_error;
  T sin2_ax = GetSin2Distance(a, x, &sin2_ax_error);
  T sin2_bx = GetSin2Distance(b, x, &sin2_bx_error);
  T diff = sin2_ax - sin2_bx;
  T error = sin2_ax_error + sin2_bx_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}